

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

void TTD::NSSnapObjects::DoAddtlValueInstantiation_SnapGeneratorInfo
               (SnapObject *snpObject,RecyclableObject *obj,InflateMap *inflator)

{
  uint uVar1;
  void *pvVar2;
  TTDVar var;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  ScriptContext *pSVar6;
  ScriptFunction *function;
  FunctionBody *this;
  ByteCodeReader *this_00;
  Recycler *this_01;
  undefined4 *puVar7;
  Var pvVar8;
  ulong uVar9;
  Type *addr;
  size_t size;
  undefined1 local_70 [8];
  TrackAllocData data;
  Type *local_38;
  
  pSVar6 = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  if (snpObject->SnapObjectTag != SnapGenerator) {
    TTDAbort_unrecoverable_error("Tag does not match.");
  }
  pvVar2 = snpObject->AddtlSnapObjectInfo;
  if (*(TTD_PTR_ID *)((long)pvVar2 + 0x18) == 0) {
    function = (ScriptFunction *)0x0;
  }
  else {
    function = (ScriptFunction *)
               InflateMap::LookupObject(inflator,*(TTD_PTR_ID *)((long)pvVar2 + 0x18));
  }
  if (function == (ScriptFunction *)0x0) {
    if (*(int *)&obj[2].type.ptr != 3) {
      TTDAbort_unrecoverable_error
                ("Unexpected null scriptFunction when generator is not in completed state");
    }
  }
  else {
    Memory::Recycler::WBSetBit((char *)(obj + 4));
    obj[4].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
         (_func_int **)function;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(obj + 4);
    this = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
    Js::FunctionBody::EnsureDynamicProfileInfo(this);
    bVar4 = Js::InterpreterStackFrame::ShouldDoProfile(this);
    this_00 = (ByteCodeReader *)
              Js::InterpreterStackFrame::CreateInterpreterStackFrameForGenerator
                        (function,this,(JavascriptGenerator *)obj,bVar4);
    if ((ByteCodeReader *)
        obj[2].super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject !=
        this_00) {
      TTDAbort_unrecoverable_error("unexpected frame mis-match");
    }
    if (*(int *)((long)pvVar2 + 4) == 0) {
      local_38 = (Type *)0x0;
    }
    else {
      data.plusSize = (size_t)*(uint *)((long)pvVar2 + 4);
      local_70 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_4282eb2;
      data.filename._0_4_ = 0x909;
      this_01 = Memory::Recycler::TrackAllocInfo(pSVar6->recycler,(TrackAllocData *)local_70);
      uVar1 = *(uint *)((long)pvVar2 + 4);
      if ((ulong)uVar1 == 0) {
        Memory::Recycler::ClearTrackAllocInfo(this_01,(TrackAllocData *)0x0);
        local_38 = (Type *)&DAT_00000008;
      }
      else {
        BVar5 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar5 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                             "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar4) goto LAB_0091f02a;
          *puVar7 = 0;
        }
        size = (ulong)uVar1 << 3;
        local_38 = (Type *)Memory::Recycler::
                           AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                                     (this_01,size);
        if (local_38 == (Type *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar4) {
LAB_0091f02a:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar7 = 0;
        }
        memset(local_38,0,size);
      }
      if (*(int *)((long)pvVar2 + 4) != 0) {
        uVar9 = 0;
        addr = local_38;
        data._32_8_ = obj;
        do {
          var = *(TTDVar *)(*(long *)((long)pvVar2 + 8) + uVar9 * 8);
          if (var == (TTDVar)0x0) {
            addr->ptr = (void *)0x0;
          }
          else {
            pvVar8 = InflateMap::InflateTTDVar(inflator,var);
            Memory::Recycler::WBSetBit((char *)addr);
            addr->ptr = pvVar8;
            Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
          }
          uVar9 = uVar9 + 1;
          addr = addr + 1;
          obj = (RecyclableObject *)data._32_8_;
        } while (uVar9 < *(uint *)((long)pvVar2 + 4));
      }
    }
    if (*(int *)((long)pvVar2 + 0x38) != 0) {
      Js::JavascriptGenerator::SetFrameSlots
                ((JavascriptGenerator *)obj,*(RegSlot *)((long)pvVar2 + 4),local_38);
      Js::InterpreterStackFrame::InitializeClosures((InterpreterStackFrame *)this_00);
      Js::ByteCodeReader::SetCurrentOffset(this_00,*(int *)((long)pvVar2 + 0x38));
    }
  }
  return;
}

Assistant:

void DoAddtlValueInstantiation_SnapGeneratorInfo(const SnapObject* snpObject, Js::RecyclableObject* obj, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            Js::JavascriptGenerator* generator = reinterpret_cast<Js::JavascriptGenerator*>(obj);

            SnapGeneratorInfo* generatorInfo = SnapObjectGetAddtlInfoAs<SnapGeneratorInfo*, SnapObjectType::SnapGenerator>(snpObject);
            Js::ScriptFunction* scriptFunction = reinterpret_cast<Js::ScriptFunction*>((generatorInfo->scriptFunction != TTD_INVALID_PTR_ID) ? inflator->LookupObject(generatorInfo->scriptFunction) : nullptr);
            if (scriptFunction != nullptr)
            {
                generator->SetScriptFunction(scriptFunction);
                Js::FunctionBody* executeFunction = scriptFunction->GetFunctionBody();

#if ENABLE_PROFILE_INFO
                // call EnsureDynamicProfileInfo or we get asserts in some cases when creating the InterpreterStackFrame
                executeFunction->EnsureDynamicProfileInfo();
#endif
                bool doProfile = Js::InterpreterStackFrame::ShouldDoProfile(executeFunction);

                Js::InterpreterStackFrame* frame = Js::InterpreterStackFrame::CreateInterpreterStackFrameForGenerator(scriptFunction, executeFunction, generator, doProfile);
                TTDAssert(generator->GetFrame() == frame, "unexpected frame mis-match");

                Field(Js::Var)* frameSlotArray = nullptr;
                if (generatorInfo->frame_slotCount != 0)
                {
                    frameSlotArray = RecyclerNewArray(ctx->GetRecycler(), Field(Js::Var), generatorInfo->frame_slotCount);

                    for (Js::RegSlot i = 0; i < generatorInfo->frame_slotCount; i++)
                    {
                        if (generatorInfo->frame_slotArray[i] != nullptr)
                        {
                            frameSlotArray[i] = inflator->InflateTTDVar(generatorInfo->frame_slotArray[i]);
                        }
                        else
                        {
                            frameSlotArray[i] = nullptr;
                        }
                    }
                }

                if (generatorInfo->byteCodeReader_offset > 0)
                {
                    generator->SetFrameSlots(generatorInfo->frame_slotCount, frameSlotArray);
                    frame->InitializeClosures();
                    frame->GetReader()->SetCurrentOffset(generatorInfo->byteCodeReader_offset);
                }
            }
            else
            {
                TTDAssert(generator->IsCompleted(), "Unexpected null scriptFunction when generator is not in completed state");
            }
        }